

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void TestLogging(bool check_counts)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ostream *poVar3;
  size_t sVar4;
  LogMessageData *pLVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000039;
  SendMethod in_R9;
  LogMessage outer;
  char s [6];
  char const_s [12];
  LogMessage local_a8;
  char local_91;
  LogMessage local_90;
  undefined1 local_80 [40];
  char local_58 [16];
  int64 local_48;
  int64 local_40;
  int64 local_38;
  
  local_80._20_4_ = (undefined4)CONCAT71(in_register_00000039,check_counts);
  local_38 = google::LogMessage::num_messages(0);
  local_40 = google::LogMessage::num_messages(1);
  local_48 = google::LogMessage::num_messages(2);
  google::LogMessage::LogMessage
            (&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0xf7);
  poVar3 = google::LogMessage::stream(&local_a8);
  local_90.allocated_ = (LogMessageData *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"foo ","");
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_90.allocated_,(long)local_90.data_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"bar ",4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  local_58[0] = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_58,1);
  std::ostream::_M_insert<double>(3.4);
  if (local_90.allocated_ != (LogMessageData *)local_80) {
    operator_delete(local_90.allocated_,local_80._0_8_ + 1);
  }
  google::LogMessage::~LogMessage(&local_a8);
  local_80._32_8_ = __errno_location();
  uVar7 = 0;
  do {
    uVar6 = *(uint *)local_80._32_8_;
    *(uint *)local_80._32_8_ = uVar7;
    TestLogging::occurrences_251 = TestLogging::occurrences_251 + 1;
    TestLogging::occurrences_mod_n_251 =
         TestLogging::occurrences_mod_n_251 + (uint)(TestLogging::occurrences_mod_n_251 < 2) * 2 +
         -1;
    local_80._16_4_ = uVar7;
    if (TestLogging::occurrences_mod_n_251 == 1) {
      local_a8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a8.data_ = (LogMessageData *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xfb,2,TestLogging::occurrences_251,in_R9);
      poVar3 = google::LogMessage::stream(&local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Plog every 2, iteration ",0x18);
      local_a8.allocated_ = (LogMessageData *)((ulong)local_a8.allocated_ & 0xffffffff00000000);
      google::operator<<(poVar3,(PRIVATE_Counter *)&local_a8);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_90);
    }
    *(uint *)local_80._32_8_ = uVar6;
    TestLogging::occurrences_254 = TestLogging::occurrences_254 + 1;
    TestLogging::occurrences_mod_n_254 =
         TestLogging::occurrences_mod_n_254 + (uint)(TestLogging::occurrences_mod_n_254 < 3) * 3 +
         -2;
    if (TestLogging::occurrences_mod_n_254 == 1) {
      local_a8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xfe,2,TestLogging::occurrences_254,in_R9);
      poVar3 = google::LogMessage::stream(&local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Log every 3, iteration ",0x17);
      local_a8.allocated_ = (LogMessageData *)((ulong)local_a8.allocated_ & 0xffffffff00000000);
      poVar3 = google::operator<<(poVar3,(PRIVATE_Counter *)&local_a8);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      google::LogMessage::~LogMessage(&local_90);
    }
    TestLogging::occurrences_255 = TestLogging::occurrences_255 + 1;
    TestLogging::occurrences_mod_n_255 =
         TestLogging::occurrences_mod_n_255 + (uint)(TestLogging::occurrences_mod_n_255 < 4) * 4 +
         -3;
    if (TestLogging::occurrences_mod_n_255 == 1) {
      local_a8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0xff,2,TestLogging::occurrences_255,in_R9);
      poVar3 = google::LogMessage::stream(&local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Log every 4, iteration ",0x17);
      local_a8.allocated_ = (LogMessageData *)((ulong)local_a8.allocated_ & 0xffffffff00000000);
      poVar3 = google::operator<<(poVar3,(PRIVATE_Counter *)&local_a8);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      google::LogMessage::~LogMessage(&local_90);
    }
    TestLogging::occurrences_257 = TestLogging::occurrences_257 + 1;
    TestLogging::occurrences_mod_n_257 =
         TestLogging::occurrences_mod_n_257 + ((TestLogging::occurrences_mod_n_257 + 1U) / 5) * -5 +
         1;
    if (TestLogging::occurrences_mod_n_257 == 1) {
      local_a8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x101,1,TestLogging::occurrences_257,in_R9);
      poVar3 = google::LogMessage::stream(&local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Log if every 5, iteration ",0x1a);
      local_a8.allocated_ = (LogMessageData *)((ulong)local_a8.allocated_ & 0xffffffff00000000);
      google::operator<<(poVar3,(PRIVATE_Counter *)&local_a8);
      google::LogMessage::~LogMessage(&local_90);
    }
    TestLogging::occurrences_258 = TestLogging::occurrences_258 + 1;
    TestLogging::occurrences_260 = TestLogging::occurrences_260 + 1;
    local_a8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
    local_a8.data_ = (LogMessageData *)0x0;
    google::LogMessage::LogMessage
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x104,0,TestLogging::occurrences_260,in_R9);
    poVar3 = google::LogMessage::stream(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Log if every 1, iteration ",0x1a);
    local_a8.allocated_ = (LogMessageData *)((ulong)local_a8.allocated_ & 0xffffffff00000000);
    google::operator<<(poVar3,(PRIVATE_Counter *)&local_a8);
    google::LogMessage::~LogMessage(&local_90);
    TestLogging::occurrences_261 = TestLogging::occurrences_261 + 1;
    if (((uint)local_80._16_4_ < 3) &&
       (uVar6 = ~TestLogging::occurrences_mod_n_261, uVar7 = TestLogging::occurrences_mod_n_261 & 1,
       TestLogging::occurrences_mod_n_261 = uVar6 & 1, uVar7 == 0)) {
      local_a8.allocated_ = (LogMessageData *)google::LogMessage::SendToLog;
      local_a8.data_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x105,2,TestLogging::occurrences_261,in_R9);
      poVar3 = google::LogMessage::stream(&local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Log if less than 3 every 2, iteration ",0x26);
      local_a8.allocated_ = (LogMessageData *)((ulong)local_a8.allocated_ & 0xffffffff00000000);
      google::operator<<(poVar3,(PRIVATE_Counter *)&local_a8);
      google::LogMessage::~LogMessage(&local_90);
    }
    uVar7 = local_80._16_4_ + 1;
  } while (uVar7 != 10);
  google::LogMessage::LogMessage
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x108,1);
  poVar3 = google::LogMessage::stream(&local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"log_if this",0xb);
  google::LogMessage::~LogMessage(&local_90);
  local_80[0x1c] = 'y';
  local_80[0x1d] = '\0';
  local_80[0x18] = 'a';
  local_80[0x19] = 'r';
  local_80[0x1a] = 'r';
  local_80[0x1b] = 'a';
  google::LogMessage::LogMessage
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x10c);
  poVar3 = google::LogMessage::stream(&local_90);
  sVar4 = strlen(local_80 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_80 + 0x18,sVar4);
  google::LogMessage::~LogMessage(&local_90);
  builtin_strncpy(local_58,"const array",0xc);
  google::LogMessage::LogMessage
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x10e);
  poVar3 = google::LogMessage::stream(&local_90);
  sVar4 = strlen(local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_58,sVar4);
  google::LogMessage::~LogMessage(&local_90);
  google::LogMessage::LogMessage
            (&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x110,2);
  poVar3 = google::LogMessage::stream(&local_a8);
  local_90.allocated_ = (LogMessageData *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"foo","");
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_90.allocated_,(long)local_90.data_);
  local_91 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_91,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1000);
  local_91 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_91,1);
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 10;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pp_Var1 = poVar3->_vptr_basic_ostream;
  *(undefined8 *)(&poVar3->field_0x10 + (long)pp_Var1[-3]) = 1;
  p_Var2 = pp_Var1[-3];
  *(uint *)(&poVar3->field_0x18 + (long)p_Var2) =
       *(uint *)(&poVar3->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
  std::ostream::operator<<(poVar3,1000);
  if (local_90.allocated_ != (LogMessageData *)local_80) {
    operator_delete(local_90.allocated_,local_80._0_8_ + 1);
  }
  google::LogMessage::~LogMessage(&local_a8);
  google::LogMessage::LogMessage
            (&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x114,2);
  poVar3 = google::LogMessage::stream(&local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"outer",5);
  google::LogMessage::LogMessage
            (&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x117,2);
  poVar3 = google::LogMessage::stream(&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"inner",5);
  google::LogMessage::~LogMessage(&local_a8);
  google::LogMessage::~LogMessage(&local_90);
  google::LogMessage::LogMessage(&local_90,"foo",-1,0);
  poVar3 = google::LogMessage::stream(&local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"no prefix",9);
  google::LogMessage::~LogMessage(&local_90);
  if (local_80[0x14] == '\0') {
    return;
  }
  local_90.allocated_ = (LogMessageData *)(local_38 + 0xe);
  pLVar5 = (LogMessageData *)0x0;
  local_a8.allocated_ = (LogMessageData *)google::LogMessage::num_messages(0);
  if (local_90.allocated_ != local_a8.allocated_) {
    pLVar5 = (LogMessageData *)
             google::MakeCheckOpString<long,long>
                       ((long *)&local_90,(long *)&local_a8,
                        "base_num_infos + 14 == LogMessage::num_messages(GLOG_INFO)");
  }
  if (pLVar5 == (LogMessageData *)0x0) {
    local_90.allocated_ = (LogMessageData *)(local_40 + 3);
    local_a8.allocated_ = (LogMessageData *)google::LogMessage::num_messages(1);
    if (local_90.allocated_ == local_a8.allocated_) {
      pLVar5 = (LogMessageData *)0x0;
    }
    else {
      pLVar5 = (LogMessageData *)
               google::MakeCheckOpString<long,long>
                         ((long *)&local_90,(long *)&local_a8,
                          "base_num_warning + 3 == LogMessage::num_messages(GLOG_WARNING)");
    }
    if (pLVar5 == (LogMessageData *)0x0) {
      local_90.allocated_ = (LogMessageData *)(local_48 + 0x11);
      local_a8.allocated_ = (LogMessageData *)google::LogMessage::num_messages(2);
      if (local_90.allocated_ == local_a8.allocated_) {
        local_a8.allocated_ = (LogMessageData *)0x0;
      }
      else {
        local_a8.allocated_ =
             (LogMessageData *)
             google::MakeCheckOpString<long,long>
                       ((long *)&local_90,(long *)&local_a8,
                        "base_num_errors + 17 == LogMessage::num_messages(GLOG_ERROR)");
      }
      if (local_a8.allocated_ == (LogMessageData *)0x0) {
        return;
      }
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11f,(CheckOpString *)&local_a8);
      google::LogMessage::stream(&local_90);
    }
    else {
      local_a8.allocated_ = pLVar5;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x11e,(CheckOpString *)&local_a8);
      google::LogMessage::stream(&local_90);
    }
  }
  else {
    local_a8.allocated_ = pLVar5;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x11d,(CheckOpString *)&local_a8);
    google::LogMessage::stream(&local_90);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_90);
}

Assistant:

void TestLogging(bool check_counts) {
  int64 base_num_infos   = LogMessage::num_messages(GLOG_INFO);
  int64 base_num_warning = LogMessage::num_messages(GLOG_WARNING);
  int64 base_num_errors  = LogMessage::num_messages(GLOG_ERROR);

  LOG(INFO) << string("foo ") << "bar " << 10 << ' ' << 3.4;
  for ( int i = 0; i < 10; ++i ) {
    int old_errno = errno;
    errno = i;
    PLOG_EVERY_N(ERROR, 2) << "Plog every 2, iteration " << COUNTER;
    errno = old_errno;

    LOG_EVERY_N(ERROR, 3) << "Log every 3, iteration " << COUNTER << endl;
    LOG_EVERY_N(ERROR, 4) << "Log every 4, iteration " << COUNTER << endl;

    LOG_IF_EVERY_N(WARNING, true, 5) << "Log if every 5, iteration " << COUNTER;
    LOG_IF_EVERY_N(WARNING, false, 3)
        << "Log if every 3, iteration " << COUNTER;
    LOG_IF_EVERY_N(INFO, true, 1) << "Log if every 1, iteration " << COUNTER;
    LOG_IF_EVERY_N(ERROR, (i < 3), 2)
        << "Log if less than 3 every 2, iteration " << COUNTER;
  }
  LOG_IF(WARNING, true) << "log_if this";
  LOG_IF(WARNING, false) << "don't log_if this";

  char s[] = "array";
  LOG(INFO) << s;
  const char const_s[] = "const array";
  LOG(INFO) << const_s;
  int j = 1000;
  LOG(ERROR) << string("foo") << ' '<< j << ' ' << setw(10) << j << " "
             << setw(1) << hex << j;

  {
    google::LogMessage outer(__FILE__, __LINE__, GLOG_ERROR);
    outer.stream() << "outer";

    LOG(ERROR) << "inner";
  }

  LogMessage("foo", LogMessage::kNoLogPrefix, GLOG_INFO).stream() << "no prefix";

  if (check_counts) {
    CHECK_EQ(base_num_infos   + 14, LogMessage::num_messages(GLOG_INFO));
    CHECK_EQ(base_num_warning + 3,  LogMessage::num_messages(GLOG_WARNING));
    CHECK_EQ(base_num_errors  + 17, LogMessage::num_messages(GLOG_ERROR));
  }
}